

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
* docopt::docopt_parse
            (string *doc,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *argv,bool help,bool version,bool options_first)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Pattern *__lhs;
  reference ppLVar5;
  undefined4 extraout_var;
  element_type *peVar6;
  DocoptArgumentError *this;
  char *pcVar7;
  byte in_CL;
  string *in_RDX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  *in_RDI;
  byte in_R8B;
  byte in_R9B;
  string leftover;
  shared_ptr<docopt::LeafPattern> *p_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  *__range2_1;
  LeafPattern *p;
  iterator __end2;
  iterator __begin2;
  vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_> *__range2;
  bool matched;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  collected;
  OptionError *error_1;
  PatternList argv_patterns;
  OptionError *error;
  vector<docopt::Option,_std::allocator<docopt::Option>_> options;
  Required pattern;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  *ret;
  string *in_stack_fffffffffffffd38;
  pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
  *in_stack_fffffffffffffd40;
  pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
  *in_stack_fffffffffffffd48;
  allocator *paVar8;
  Tokens *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffd60;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffd68;
  value *in_stack_fffffffffffffd70;
  value *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd88;
  BranchPattern *in_stack_fffffffffffffd90;
  allocator local_1f9;
  string local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  PatternList *in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
  local_198;
  undefined1 *local_190;
  LeafPattern *local_188;
  LeafPattern **local_180;
  __normal_iterator<docopt::LeafPattern_**,_std::vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_>_>
  local_178;
  undefined1 local_170 [24];
  undefined1 *local_158;
  undefined1 local_14a;
  byte local_149;
  undefined1 local_148 [71];
  undefined1 in_stack_fffffffffffffeff;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *in_stack_ffffffffffffff00;
  Tokens *in_stack_ffffffffffffff08;
  undefined1 local_d0 [181];
  byte local_1b;
  byte local_1a;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_1b = in_R9B & 1;
  Required::Required((Required *)in_stack_fffffffffffffd50);
  std::vector<docopt::Option,_std::allocator<docopt::Option>_>::vector
            ((vector<docopt::Option,_std::allocator<docopt::Option>_> *)0x2bb878);
  create_pattern_tree(in_RDX);
  std::tie<docopt::Required,std::vector<docopt::Option,std::allocator<docopt::Option>>>
            (&in_stack_fffffffffffffd48->first,
             (vector<docopt::Option,_std::allocator<docopt::Option>_> *)in_stack_fffffffffffffd40);
  std::tuple<docopt::Required&,std::vector<docopt::Option,std::allocator<docopt::Option>>&>::
  operator=((tuple<docopt::Required_&,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_&>
             *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>::~pair
            (in_stack_fffffffffffffd40);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)0x2bb9ae);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Tokens::Tokens(in_stack_fffffffffffffd50,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd48,SUB81((ulong)in_stack_fffffffffffffd40 >> 0x38,0));
  parse_argv(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::operator=((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)in_stack_fffffffffffffd50,
              (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)in_stack_fffffffffffffd48);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)in_stack_fffffffffffffd50);
  Tokens::~Tokens((Tokens *)0x2bba3a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&in_stack_fffffffffffffd50->fTokens);
  extras((bool)in_stack_fffffffffffffe47,(bool)in_stack_fffffffffffffe46,in_stack_fffffffffffffe38);
  std::
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ::vector((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
            *)0x2bbb92);
  __lhs = BranchPattern::fix(in_stack_fffffffffffffd90);
  uVar3 = (*__lhs->_vptr_Pattern[2])(__lhs,local_d0,local_148);
  bVar1 = (byte)uVar3;
  local_149 = bVar1 & 1;
  if (((uVar3 & 1) != 0) &&
     (bVar2 = std::
              vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ::empty((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       *)in_stack_fffffffffffffd50), bVar2)) {
    local_14a = 0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
           *)0x2bbc10);
    Pattern::leaves((Pattern *)in_stack_fffffffffffffd68._M_current);
    local_158 = local_170;
    local_178._M_current =
         (LeafPattern **)
         std::vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_>::begin
                   ((vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_> *)
                    in_stack_fffffffffffffd38);
    local_180 = (LeafPattern **)
                std::vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_>::end
                          ((vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_> *)
                           in_stack_fffffffffffffd38);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<docopt::LeafPattern_**,_std::vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_>_>
                               *)in_stack_fffffffffffffd40,
                              (__normal_iterator<docopt::LeafPattern_**,_std::vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_>_>
                               *)in_stack_fffffffffffffd38), bVar2) {
      ppLVar5 = __gnu_cxx::
                __normal_iterator<docopt::LeafPattern_**,_std::vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_>_>
                ::operator*(&local_178);
      local_188 = *ppLVar5;
      in_stack_fffffffffffffd78 = LeafPattern::getValue(local_188);
      iVar4 = (*(local_188->super_Pattern)._vptr_Pattern[3])();
      in_stack_fffffffffffffd70 = (value *)CONCAT44(extraout_var,iVar4);
      in_stack_fffffffffffffd68._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                         *)CONCAT17(bVar1,in_stack_fffffffffffffd80),
                        (key_type *)in_stack_fffffffffffffd78);
      value::operator=(in_stack_fffffffffffffd70,(value *)in_stack_fffffffffffffd68._M_current);
      __gnu_cxx::
      __normal_iterator<docopt::LeafPattern_**,_std::vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_>_>
      ::operator++(&local_178);
    }
    std::vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_>::~vector
              ((vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_> *)
               in_stack_fffffffffffffd50);
    local_190 = local_148;
    local_198._M_current =
         (shared_ptr<docopt::LeafPattern> *)
         std::
         vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
         ::begin((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                  *)in_stack_fffffffffffffd38);
    std::
    vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ::end((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
           *)in_stack_fffffffffffffd38);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                               *)in_stack_fffffffffffffd40,
                              (__normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
                               *)in_stack_fffffffffffffd38), bVar2) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
      ::operator*(&local_198);
      peVar6 = std::
               __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2bbdf9);
      LeafPattern::getValue(peVar6);
      peVar6 = std::
               __shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2bbe15);
      (*(peVar6->super_Pattern)._vptr_Pattern[3])();
      in_stack_fffffffffffffd50 =
           (Tokens *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                         *)CONCAT17(bVar1,in_stack_fffffffffffffd80),
                        (key_type *)in_stack_fffffffffffffd78);
      value::operator=(in_stack_fffffffffffffd70,(value *)in_stack_fffffffffffffd68._M_current);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
      ::operator++(&local_198);
    }
    local_14a = 1;
    std::
    vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ::~vector((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
               *)in_stack_fffffffffffffd50);
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)in_stack_fffffffffffffd50);
    std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector
              ((vector<docopt::Option,_std::allocator<docopt::Option>_> *)in_stack_fffffffffffffd50)
    ;
    Required::~Required((Required *)0x2bbeb9);
    return in_RDI;
  }
  if ((local_149 & 1) != 0) {
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffd38);
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffd38);
    paVar8 = &local_1f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,", ",paVar8);
    (anonymous_namespace)::
    join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    this = (DocoptArgumentError *)__cxa_allocate_exception(0x10);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar1,in_stack_fffffffffffffd80));
    DocoptArgumentError::runtime_error(this,in_stack_fffffffffffffd38);
    __cxa_throw(this,&DocoptArgumentError::typeinfo,DocoptArgumentError::~DocoptArgumentError);
  }
  pcVar7 = (char *)__cxa_allocate_exception(0x10);
  DocoptArgumentError::runtime_error((DocoptArgumentError *)in_stack_fffffffffffffd40,pcVar7);
  __cxa_throw(pcVar7,&DocoptArgumentError::typeinfo,DocoptArgumentError::~DocoptArgumentError);
}

Assistant:

std::map<std::string, value>
docopt::docopt_parse(std::string const& doc,
		     std::vector<std::string> const& argv,
		     bool help,
		     bool version,
		     bool options_first)
{
	//std::cout << "doc: " << doc << std::endl;
	//std::cout << "argv: " << argv << std::endl;
	
	Required pattern;
	std::vector<Option> options;
	try {
		std::tie(pattern, options) = create_pattern_tree(doc);
	} catch (Tokens::OptionError const& error) {
		throw DocoptLanguageError(error.what());
	}
	
	PatternList argv_patterns;
	try {
		argv_patterns = parse_argv(Tokens(argv), options, options_first);
	} catch (Tokens::OptionError const& error) {
		throw DocoptArgumentError(error.what());
	}
	
	extras(help, version, argv_patterns);
	
	std::vector<std::shared_ptr<LeafPattern>> collected;
	bool matched = pattern.fix().match(argv_patterns, collected);
	if (matched && argv_patterns.empty()) {
		std::map<std::string, value> ret;
		
		// (a.name, a.value) for a in (pattern.flat() + collected)
		for (auto* p : pattern.leaves()) {
			ret[p->name()] = p->getValue();
		}
		
		for (auto const& p : collected) {
			ret[p->name()] = p->getValue();
		}
		
		return ret;
	}
	
	if (matched) {
		std::string leftover = join(argv.begin(), argv.end(), ", ");
		throw DocoptArgumentError("Unexpected argument: " + leftover);
	}
	
	throw DocoptArgumentError("Arguments did not match expected patterns"); // BLEH. Bad error.
}